

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this,ByteData *serialize_data,ByteData256 *tweak_sum)

{
  CfdException *this_00;
  bool bVar1;
  allocator local_41;
  string local_40;
  
  Extkey::Extkey(&this->super_Extkey,serialize_data,tweak_sum);
  bVar1 = Privkey::IsValid(&(this->super_Extkey).privkey_);
  if (bVar1) {
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Invalid serialize data. this data is ExtPubkey data.",&local_41);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ExtPrivkey::ExtPrivkey(
    const ByteData& serialize_data, const ByteData256& tweak_sum)
    : Extkey(serialize_data, tweak_sum) {
  if (!privkey_.IsValid()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid serialize data. this data is ExtPubkey data.");
  }
}